

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  native_type __fd_00;
  int iVar1;
  int *piVar2;
  sockaddr *extraout_RAX;
  error_code eVar3;
  native_type new_fd;
  undefined4 uStackY_2c;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    iVar1 = ::accept(__fd_00,(sockaddr *)0x0,(socklen_t *)0x0);
    if (-1 < iVar1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 == -1) {
    eVar3 = socket_details::geterror();
    iVar1 = eVar3._M_value;
    __addr->sa_family = (short)iVar1;
    __addr->sa_data[0] = (char)((uint)iVar1 >> 0x10);
    __addr->sa_data[1] = (char)((uint)iVar1 >> 0x18);
    __addr->sa_data[2] = (char)uStackY_2c;
    __addr->sa_data[3] = (char)((uint)uStackY_2c >> 8);
    __addr->sa_data[4] = (char)((uint)uStackY_2c >> 0x10);
    __addr->sa_data[5] = (char)((uint)uStackY_2c >> 0x18);
    *(error_category **)(__addr->sa_data + 6) = eVar3._M_cat;
  }
  else {
    basic_io_device::assign
              ((basic_io_device *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
               (native_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    __addr = extraout_RAX;
  }
  return (int)__addr;
}

Assistant:

void acceptor::accept(stream_socket &target,system::error_code &e)
{
	native_type new_fd = invalid_socket;
	#ifndef BOOSTER_WIN32
	for(;;) {
		new_fd = ::accept(native(),0,0);
		if(new_fd < 0 && errno==EINTR)
			continue;
		break;
	}
	#else
	new_fd = ::accept(native(),0,0);
	#endif

	if(new_fd == invalid_socket) {
		e=geterror();
		return;
	}

	target.assign(new_fd);
	return;
}